

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O0

ktx_error_code_e ktxTexture1_IterateLevels(ktxTexture1 *This,PFNKTXITERCB iterCb,void *userdata)

{
  ktx_size_t kVar1;
  byte bVar2;
  ktxTexture *in_RDX;
  code *in_RSI;
  long in_RDI;
  ktx_size_t offset;
  ktx_uint32_t levelSize;
  GLsizei depth;
  GLsizei height;
  GLsizei width;
  ktx_error_code_e result;
  ktx_uint32_t miplevel;
  long in_stack_ffffffffffffff98;
  ktxTexture *in_stack_ffffffffffffffa0;
  uint local_4c;
  uint local_48;
  uint local_44;
  long local_40;
  undefined4 local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  ktx_error_code_e local_28;
  uint local_24;
  ktxTexture *local_20;
  code *local_18;
  long local_10;
  ktx_error_code_e local_4;
  
  local_28 = KTX_SUCCESS;
  if (in_RDI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else if (in_RSI == (code *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_24 = 0; local_24 < *(uint *)(local_10 + 0x34); local_24 = local_24 + 1) {
      bVar2 = (byte)local_24;
      if (*(uint *)(local_10 + 0x24) >> (bVar2 & 0x1f) == 0) {
        local_44 = 1;
      }
      else {
        local_44 = *(uint *)(local_10 + 0x24) >> (bVar2 & 0x1f);
      }
      local_2c = local_44;
      if (*(uint *)(local_10 + 0x28) >> (bVar2 & 0x1f) == 0) {
        local_48 = 1;
      }
      else {
        local_48 = *(uint *)(local_10 + 0x28) >> (bVar2 & 0x1f);
      }
      local_30 = local_48;
      if (*(uint *)(local_10 + 0x2c) >> (bVar2 & 0x1f) == 0) {
        local_4c = 1;
      }
      else {
        local_4c = *(uint *)(local_10 + 0x2c) >> (bVar2 & 0x1f);
      }
      local_34 = local_4c;
      kVar1 = ktxTexture_calcLevelSize
                        (in_stack_ffffffffffffffa0,
                         (ktx_uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (ktxFormatVersionEnum)in_stack_ffffffffffffff98);
      local_38 = (undefined4)kVar1;
      (**(code **)(*(long *)(local_10 + 8) + 8))(local_10,local_24,0,0,&local_40);
      in_stack_ffffffffffffff98 = *(long *)(local_10 + 0x70) + local_40;
      in_stack_ffffffffffffffa0 = local_20;
      local_28 = (*local_18)(local_24,0,local_2c,local_30,local_34,local_38);
      if (local_28 != KTX_SUCCESS) break;
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture1_IterateLevels(ktxTexture1* This, PFNKTXITERCB iterCb, void* userdata)
{
    ktx_uint32_t    miplevel;
    KTX_error_code  result = KTX_SUCCESS;

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (iterCb == NULL)
        return KTX_INVALID_VALUE;

    for (miplevel = 0; miplevel < This->numLevels; ++miplevel)
    {
        GLsizei width, height, depth;
        ktx_uint32_t levelSize;
        ktx_size_t offset;

        /* Array textures have the same number of layers at each mip level. */
        width = MAX(1, This->baseWidth  >> miplevel);
        height = MAX(1, This->baseHeight >> miplevel);
        depth = MAX(1, This->baseDepth  >> miplevel);

        levelSize = (ktx_uint32_t)ktxTexture_calcLevelSize(ktxTexture(This),
                                                       miplevel,
                                                       KTX_FORMAT_VERSION_ONE);

        /* All array layers are passed in a group because that is how
         * GL & Vulkan need them. Hence no
         *    for (layer = 0; layer < This->numLayers)
         */
        ktxTexture_GetImageOffset(ktxTexture(This), miplevel, 0, 0, &offset);
        result = iterCb(miplevel, 0, width, height, depth,
                         levelSize, This->pData + offset, userdata);
        if (result != KTX_SUCCESS)
            break;
    }

    return result;
}